

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O0

bool __thiscall kj::anon_unknown_9::DiskDirectory::tryRemove(DiskDirectory *this,PathPtr path)

{
  bool bVar1;
  DiskDirectory *this_local;
  PathPtr path_local;
  
  bVar1 = DiskHandle::tryRemove(&this->super_DiskHandle,path);
  return bVar1;
}

Assistant:

bool tryRemove(PathPtr path) const override {
    return DiskHandle::tryRemove(path);
  }